

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::FormalArgumentSymbol::serializeTo(FormalArgumentSymbol *this,ASTSerializer *serializer)

{
  Expression *__n;
  string_view sVar1;
  
  VariableSymbol::serializeTo(&this->super_VariableSymbol,serializer);
  sVar1 = ast::toString(this->direction);
  ASTSerializer::write(serializer,9,"direction",sVar1._M_len);
  __n = getDefaultValue(this);
  if (__n != (Expression *)0x0) {
    ASTSerializer::write(serializer,0xc,"defaultValue",(size_t)__n);
    return;
  }
  return;
}

Assistant:

void FormalArgumentSymbol::serializeTo(ASTSerializer& serializer) const {
    VariableSymbol::serializeTo(serializer);

    serializer.write("direction", toString(direction));
    if (auto defVal = getDefaultValue())
        serializer.write("defaultValue", *defVal);
}